

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

void http_proxy_cf_close(Curl_cfilter *cf,Curl_easy *data)

{
  long *plVar1;
  Curl_cfilter *local_28;
  Curl_cfilter *f;
  cf_proxy_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  if (*plVar1 != 0) {
    for (local_28 = cf->next; local_28 != (Curl_cfilter *)0x0; local_28 = local_28->next) {
      if (local_28 == (Curl_cfilter *)*plVar1) {
        Curl_conn_cf_discard_sub(cf,(Curl_cfilter *)*plVar1,data,false);
        break;
      }
    }
    *plVar1 = 0;
  }
  if (cf->next != (Curl_cfilter *)0x0) {
    (*(code *)cf->next->cft->do_close)(cf->next,data);
  }
  return;
}

Assistant:

static void http_proxy_cf_close(struct Curl_cfilter *cf,
                                struct Curl_easy *data)
{
  struct cf_proxy_ctx *ctx = cf->ctx;

  CURL_TRC_CF(data, cf, "close");
  cf->connected = FALSE;
  if(ctx->cf_protocol) {
    struct Curl_cfilter *f;
    /* if someone already removed it, we assume he also
     * took care of destroying it. */
    for(f = cf->next; f; f = f->next) {
      if(f == ctx->cf_protocol) {
        /* still in our sub-chain */
        Curl_conn_cf_discard_sub(cf, ctx->cf_protocol, data, FALSE);
        break;
      }
    }
    ctx->cf_protocol = NULL;
  }
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
}